

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O3

void __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::writeToBinaryFile
          (KernelPerformanceInfo *this,FILE *output)

{
  ulong uVar1;
  int iVar2;
  undefined4 in_EAX;
  int *__ptr;
  uint32_t recordLen;
  undefined8 uStack_28;
  
  uVar1 = (this->kernelName)._M_string_length;
  iVar2 = (int)uVar1;
  uStack_28 = CONCAT44(iVar2 + 0x20U,in_EAX);
  __ptr = (int *)malloc((ulong)(iVar2 + 0x20U));
  *__ptr = iVar2;
  if (iVar2 != 0) {
    memcpy(__ptr + 1,(this->kernelName)._M_dataplus._M_p,uVar1 & 0xffffffff);
  }
  *(uint64_t *)((long)__ptr + (ulong)(iVar2 + 4)) = this->callCount;
  *(double *)((long)__ptr + (ulong)(iVar2 + 0xc)) = this->time;
  *(double *)((long)__ptr + (ulong)(iVar2 + 0x14)) = this->timeSq;
  *(KernelExecutionType *)((long)__ptr + (ulong)(iVar2 + 0x1c)) = this->kType;
  fwrite((void *)((long)&uStack_28 + 4),4,1,(FILE *)output);
  fwrite(__ptr,uStack_28 >> 0x20,1,(FILE *)output);
  free(__ptr);
  return;
}

Assistant:

void writeToBinaryFile(FILE* output) {
    const uint32_t kernelNameLen = kernelName.size();
    const uint32_t recordLen = sizeof(uint32_t) + sizeof(char) * kernelNameLen +
                               sizeof(uint64_t) + sizeof(double) +
                               sizeof(double) + sizeof(uint32_t);

    uint32_t nextIndex = 0;
    char* entry        = (char*)malloc(recordLen);

    copy(&entry[nextIndex], (char*)&kernelNameLen, sizeof(kernelNameLen));
    nextIndex += sizeof(kernelNameLen);

    copy(&entry[nextIndex], kernelName.c_str(), kernelNameLen);
    nextIndex += kernelNameLen;

    copy(&entry[nextIndex], (char*)&callCount, sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy(&entry[nextIndex], (char*)&time, sizeof(time));
    nextIndex += sizeof(time);

    copy(&entry[nextIndex], (char*)&timeSq, sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelTypeOutput = (uint32_t)kType;
    copy(&entry[nextIndex], (char*)&kernelTypeOutput, sizeof(kernelTypeOutput));
    nextIndex += sizeof(kernelTypeOutput);

    fwrite(&recordLen, sizeof(uint32_t), 1, output);
    fwrite(entry, recordLen, 1, output);
    free(entry);
  }